

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetMonitorFrequency(void *cvode_mem,long nst)

{
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    error_code = -0x15;
  }
  else {
    if (-1 < nst) {
      msgfmt = "SUNDIALS was not built with monitoring enabled.";
      error_code = -0x16;
      goto LAB_003db6a7;
    }
    msgfmt = "step interval must be >= 0\n";
    error_code = -0x16;
  }
  cvode_mem = (CVodeMem)0x0;
LAB_003db6a7:
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetMonitorFrequency",msgfmt);
  return error_code;
}

Assistant:

int CVodeSetMonitorFrequency(void *cvode_mem, long int nst)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetMonitorFrequency", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  if (nst < 0) {
    cvProcessError(NULL, CV_ILL_INPUT, "CVODE", "CVodeSetMonitorFrequency", "step interval must be >= 0\n");
    return(CV_ILL_INPUT);
  }

  cv_mem = (CVodeMem) cvode_mem;

#ifdef SUNDIALS_BUILD_WITH_MONITORING
  cv_mem->cv_monitor_interval = nst;
  return(CV_SUCCESS);
#else
  cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetMonitorFrequency", "SUNDIALS was not built with monitoring enabled.");
  return(CV_ILL_INPUT);
#endif
}